

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  ulong uVar1;
  string *input;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  FieldDescriptor::default_value_string_abi_cxx11_(descriptor);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    input = FieldDescriptor::default_value_string_abi_cxx11_(local_20);
    StringToBase64(&local_78,input);
    std::operator+(&local_58,"pb::ByteString.FromBase64(\"",&local_78);
    std::operator+(__return_storage_ptr__,&local_58,"\")");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"pb::ByteString.Empty",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    else
        return "pb::ByteString.FromBase64(\"" + StringToBase64(descriptor->default_value_string()) + "\")";
}